

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaEvalErrorNodeType(xmlSchemaAbstractCtxtPtr actxt,xmlNodePtr node)

{
  xmlNodePtr node_local;
  xmlSchemaAbstractCtxtPtr actxt_local;
  
  if (node == (xmlNodePtr)0x0) {
    if ((actxt->type == 2) && (*(long *)(actxt + 0xc) != 0)) {
      actxt_local._4_4_ = **(xmlElementType **)(actxt + 0xc);
    }
    else {
      actxt_local._4_4_ = 0xffffffff;
    }
  }
  else {
    actxt_local._4_4_ = node->type;
  }
  return actxt_local._4_4_;
}

Assistant:

static int
xmlSchemaEvalErrorNodeType(xmlSchemaAbstractCtxtPtr actxt,
			   xmlNodePtr node)
{
    if (node != NULL)
	return (node->type);
    if ((actxt->type == XML_SCHEMA_CTXT_VALIDATOR) &&
	(((xmlSchemaValidCtxtPtr) actxt)->inode != NULL))
	return ( ((xmlSchemaValidCtxtPtr) actxt)->inode->nodeType);
    return (-1);
}